

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

void Ssw_ClassesPrint(Ssw_Cla_t *p,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppAVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  Aig_Man_t *pAVar8;
  int level;
  Ssw_Cla_t *pSVar9;
  Aig_Man_t *pAVar10;
  long lVar11;
  ulong uVar12;
  
  pSVar9 = p;
  Abc_Print((int)p,"Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",(ulong)(uint)p->nCands1,
            (ulong)(uint)p->nClasses,(ulong)(uint)(p->nLits + p->nCands1));
  if (fVeryVerbose != 0) {
    Abc_Print((int)pSVar9,"Constants { ");
    pAVar10 = p->pAig;
    pVVar6 = pAVar10->vObjs;
    if (0 < pVVar6->nSize) {
      lVar11 = 0;
      do {
        pObj = (Aig_Obj_t *)pVVar6->pArray[lVar11];
        if (pObj != (Aig_Obj_t *)0x0) {
          if (pAVar10->pReprs == (Aig_Obj_t **)0x0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = pAVar10->pReprs[pObj->Id];
          }
          if (pAVar7 == pAVar10->pConst1) {
            uVar1 = pObj->Id;
            uVar2 = *(uint *)&pObj->field_0x1c;
            uVar4 = Aig_SupportSize(pAVar10,pObj);
            pAVar10 = p->pAig;
            uVar5 = Aig_NodeMffcSupp(pAVar10,pObj,0,(Vec_Ptr_t *)0x0);
            Abc_Print((int)pAVar10,"%d(%d,%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),
                      (ulong)uVar4,(ulong)uVar5);
            pAVar10 = p->pAig;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pAVar10->vObjs;
      } while (lVar11 < pVVar6->nSize);
    }
    Abc_Print((int)pAVar10,"}\n");
    level = (int)pAVar10;
    pAVar8 = p->pAig;
    if (0 < pAVar8->vObjs->nSize) {
      uVar12 = 0;
      do {
        ppAVar3 = p->pId2Class[uVar12];
        if (ppAVar3 != (Aig_Obj_t **)0x0) {
          Abc_Print((int)pAVar10,"%3d (%3d) : ",uVar12 & 0xffffffff,
                    (ulong)(uint)p->pClassSizes[uVar12]);
          pAVar10 = (Aig_Man_t *)p;
          Ssw_ClassesPrintOne(p,*ppAVar3);
          pAVar8 = p->pAig;
        }
        level = (int)pAVar10;
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)pAVar8->vObjs->nSize);
    }
    Abc_Print(level,"\n");
    return;
  }
  return;
}

Assistant:

void Ssw_ClassesPrint( Ssw_Cla_t * p, int fVeryVerbose )
{
    Aig_Obj_t ** ppClass;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Equiv classes: Const1 = %5d. Class = %5d. Lit = %5d.\n",
        p->nCands1, p->nClasses, p->nCands1+p->nLits );
    if ( !fVeryVerbose )
        return;
    Abc_Print( 1, "Constants { " );
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
            Abc_Print( 1, "%d(%d,%d,%d) ", pObj->Id, pObj->Level,
            Aig_SupportSize(p->pAig,pObj), Aig_NodeMffcSupp(p->pAig,pObj,0,NULL) );
    Abc_Print( 1, "}\n" );
    Ssw_ManForEachClass( p, ppClass, i )
    {
        Abc_Print( 1, "%3d (%3d) : ", i, p->pClassSizes[i] );
        Ssw_ClassesPrintOne( p, ppClass[0] );
    }
    Abc_Print( 1, "\n" );
}